

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O0

void move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  double dVar2;
  bool bVar3;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  Expression_lhs<const_int_&> *this;
  Enum EVar4;
  undefined1 *puVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  Expression_lhs<const_int_&> EVar6;
  ResultBuilder DOCTEST_RB_4;
  ResultBuilder DOCTEST_RB_3;
  MoveOnly1 red;
  ResultBuilder DOCTEST_RB_2;
  MoveOnly1 *i_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<MoveOnly1,_std::allocator<MoveOnly1>_> *__range2_1;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  MoveOnly2 res;
  MoveOnly1 *i;
  iterator __end2;
  iterator __begin2;
  vector<MoveOnly1,_std::allocator<MoveOnly1>_> *__range2;
  vector<MoveOnly1,_std::allocator<MoveOnly1>_> vec;
  size_t N;
  StaticPartitioner<tf::DefaultClosureWrapper> partitioner;
  size_t c;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<int> *__range1;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffff718;
  Result *pRVar7;
  Taskflow *in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff728;
  Enum in_stack_fffffffffffff72c;
  allocator_type *in_stack_fffffffffffff730;
  undefined1 *in_stack_fffffffffffff738;
  Enum at;
  Taskflow *in_stack_fffffffffffff740;
  Executor *in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff7a0;
  ExpressionDecomposer local_80c;
  allocator_type *local_808;
  Enum local_800;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffff808;
  size_t in_stack_fffffffffffff810;
  Executor *in_stack_fffffffffffff818;
  ResultBuilder local_7d8;
  __basic_future<void> local_760 [2];
  FlowBuilder local_740;
  undefined4 local_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  MoveOnly1 *local_718;
  MoveOnly1 *local_710;
  undefined8 local_708;
  Executor *local_700;
  Enum local_6f8;
  ExpressionDecomposer local_6ec;
  Executor *local_6e8;
  Enum local_6e0;
  ResultBuilder local_6b8;
  __basic_future<void> local_640 [2];
  FlowBuilder local_620;
  undefined4 local_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  MoveOnly1 *local_5f8;
  MoveOnly1 *local_5f0;
  MoveOnly1 local_5e8;
  undefined4 local_5e4;
  int *local_5e0;
  Enum local_5d8;
  ExpressionDecomposer local_5cc;
  int *local_5c8;
  Enum local_5c0;
  ResultBuilder local_598;
  reference local_520;
  MoveOnly1 *local_518;
  __normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_> local_510;
  undefined1 *local_508;
  int *local_500;
  Enum local_4f8;
  ExpressionDecomposer local_4ec;
  int *local_4e8;
  Enum local_4e0;
  ResultBuilder local_4b8;
  __basic_future<void> local_440 [2];
  FlowBuilder local_420;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  MoveOnly1 *local_3f8;
  MoveOnly1 *local_3f0;
  undefined8 local_3e8;
  Expression_lhs<const_int_&> *local_3e0;
  Enum local_3d8;
  ExpressionDecomposer local_3cc;
  Expression_lhs<const_int_&> *local_3c8;
  Enum local_3c0;
  ResultBuilder local_398;
  __basic_future<void> local_320 [2];
  FlowBuilder local_300;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  MoveOnly1 *local_2e0;
  MoveOnly1 *local_2d8;
  MoveOnly2 local_2cc;
  reference local_2c8;
  MoveOnly1 *local_2c0;
  __normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_> local_2b8;
  undefined1 *local_2b0;
  undefined1 local_2a0 [24];
  undefined8 local_288;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  long local_270;
  int *local_268;
  int *local_260;
  int local_254 [5];
  initializer_list<int> local_240;
  initializer_list<int> *local_230;
  Taskflow local_228;
  undefined1 local_140 [320];
  
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffff720,in_stack_fffffffffffff718)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffff818,in_stack_fffffffffffff810,in_stack_fffffffffffff808);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x199da2);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff740);
  local_254[0] = 0;
  local_254[1] = 1;
  local_254[2] = 3;
  local_254[3] = 7;
  local_254[4] = 99;
  local_240._M_array = local_254;
  local_240._M_len = 5;
  local_230 = &local_240;
  local_260 = std::initializer_list<int>::begin(local_230);
  local_268 = std::initializer_list<int>::end((initializer_list<int> *)in_stack_fffffffffffff720);
  while( true ) {
    if (local_260 == local_268) {
      tf::Taskflow::~Taskflow(in_stack_fffffffffffff720);
      tf::Executor::~Executor(in_stack_fffffffffffff750);
      return;
    }
    local_270 = (long)*local_260;
    tf::StaticPartitioner<tf::DefaultClosureWrapper>::StaticPartitioner
              ((StaticPartitioner<tf::DefaultClosureWrapper> *)in_stack_fffffffffffff720,
               (size_t)in_stack_fffffffffffff718);
    tf::Taskflow::clear((Taskflow *)0x199e7f);
    local_288 = 100000;
    std::allocator<MoveOnly1>::allocator((allocator<MoveOnly1> *)0x199ea0);
    std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::vector
              ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)in_stack_fffffffffffff740,
               (size_type)in_stack_fffffffffffff738,in_stack_fffffffffffff730);
    std::allocator<MoveOnly1>::~allocator((allocator<MoveOnly1> *)0x199ec9);
    local_2b0 = local_2a0;
    local_2b8._M_current =
         (MoveOnly1 *)
         std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::begin
                   ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)in_stack_fffffffffffff718);
    local_2c0 = (MoveOnly1 *)
                std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::end
                          ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)
                           in_stack_fffffffffffff718);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>
                          *)in_stack_fffffffffffff720,
                         (__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>
                          *)in_stack_fffffffffffff718);
      if (!bVar3) break;
      local_2c8 = __gnu_cxx::
                  __normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>
                  ::operator*(&local_2b8);
      local_2c8->a = 1;
      __gnu_cxx::__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>
      ::operator++(&local_2b8);
    }
    MoveOnly2::MoveOnly2(&local_2cc);
    local_2cc.b = 100;
    local_2d8 = (MoveOnly1 *)
                std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::begin
                          ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)
                           in_stack_fffffffffffff718);
    local_2e0 = (MoveOnly1 *)
                std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::end
                          ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)
                           in_stack_fffffffffffff718);
    local_2f8 = local_280;
    uStack_2f4 = uStack_27c;
    uStack_2f0 = uStack_278;
    uStack_2ec = uStack_274;
    tf::FlowBuilder::
    transform_reduce<__gnu_cxx::__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>,___gnu_cxx::__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>,_MoveOnly2,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:805:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:810:7),_tf::StaticPartitioner<tf::DefaultClosureWrapper>,_nullptr>
              (&local_300,&local_228,local_2d8,local_2e0,&local_2cc,CONCAT44(uStack_27c,local_280));
    puVar5 = local_140;
    tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                      in_stack_fffffffffffff720);
    std::__basic_future<void>::wait(local_320,puVar5);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff720);
    pRVar7 = (Result *)0x2150c5;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff740,
               (Enum)((ulong)in_stack_fffffffffffff738 >> 0x20),(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff72c,(char *)in_stack_fffffffffffff720,"",
               (char *)in_stack_fffffffffffff750);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3cc,DT_REQUIRE);
    EVar6 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                      ((ExpressionDecomposer *)in_stack_fffffffffffff720,(int *)pRVar7);
    this = (Expression_lhs<const_int_&> *)EVar6.lhs;
    EVar4 = EVar6.m_at;
    local_3e8 = 0x18704;
    local_3e0 = this;
    local_3d8 = EVar4;
    local_3c8 = this;
    local_3c0 = EVar4;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (this,(unsigned_long *)CONCAT44(EVar4,in_stack_fffffffffffff7a0));
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff720,pRVar7);
    doctest::detail::Result::~Result((Result *)0x19a19e);
    dVar2 = doctest::detail::ResultBuilder::log
                      (&local_398,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    in_stack_fffffffffffff7a0 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffff7a0);
    if ((extraout_AL & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff720);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x19a2b9);
    tf::Taskflow::clear((Taskflow *)0x19a2d0);
    local_2cc.b = 0;
    local_3f0 = (MoveOnly1 *)
                std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::begin
                          ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)pRVar7);
    local_3f8 = (MoveOnly1 *)
                std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::end
                          ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)pRVar7);
    local_418 = local_280;
    uStack_414 = uStack_27c;
    uStack_410 = uStack_278;
    uStack_40c = uStack_274;
    tf::FlowBuilder::
    transform_reduce<__gnu_cxx::__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>,___gnu_cxx::__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>,_MoveOnly2,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:827:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:832:7),_tf::StaticPartitioner<tf::DefaultClosureWrapper>,_nullptr>
              (&local_420,&local_228,local_3f0,local_3f8,&local_2cc,CONCAT44(uStack_27c,local_280));
    puVar5 = local_140;
    tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                      in_stack_fffffffffffff720);
    std::__basic_future<void>::wait(local_440,puVar5);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff720);
    pRVar7 = (Result *)0x2150c5;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff740,
               (Enum)((ulong)in_stack_fffffffffffff738 >> 0x20),(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff72c,(char *)in_stack_fffffffffffff720,"",
               (char *)in_stack_fffffffffffff750);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4ec,DT_REQUIRE);
    EVar6 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                      ((ExpressionDecomposer *)in_stack_fffffffffffff720,(int *)pRVar7);
    local_500 = EVar6.lhs;
    local_4f8 = EVar6.m_at;
    local_4e8 = local_500;
    local_4e0 = local_4f8;
    doctest::detail::Expression_lhs<const_int_&>::operator==<unsigned_long,_nullptr>
              (this,(unsigned_long *)CONCAT44(EVar4,in_stack_fffffffffffff7a0));
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff720,pRVar7);
    doctest::detail::Result::~Result((Result *)0x19a46a);
    dVar2 = doctest::detail::ResultBuilder::log
                      (&local_4b8,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    if ((extraout_AL_00 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff720);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x19a578);
    local_508 = local_2a0;
    local_510._M_current =
         (MoveOnly1 *)
         std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::begin
                   ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)pRVar7);
    local_518 = (MoveOnly1 *)
                std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::end
                          ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)pRVar7);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>
                          *)in_stack_fffffffffffff720,
                         (__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>
                          *)pRVar7);
      at = (Enum)((ulong)in_stack_fffffffffffff738 >> 0x20);
      if (!bVar3) break;
      local_520 = __gnu_cxx::
                  __normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>
                  ::operator*(&local_510);
      pRVar7 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)in_stack_fffffffffffff740,
                 (Enum)((ulong)in_stack_fffffffffffff738 >> 0x20),(char *)in_stack_fffffffffffff730,
                 in_stack_fffffffffffff72c,(char *)in_stack_fffffffffffff720,"",
                 (char *)in_stack_fffffffffffff750);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_5cc,DT_REQUIRE);
      EVar6 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)in_stack_fffffffffffff720,(int *)pRVar7);
      local_5e0 = EVar6.lhs;
      local_5d8 = EVar6.m_at;
      local_5e4 = 0xfffffff9;
      local_5c8 = local_5e0;
      local_5c0 = local_5d8;
      doctest::detail::Expression_lhs<int_const&>::operator==
                (this,(int *)CONCAT44(EVar4,in_stack_fffffffffffff7a0));
      doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff720,pRVar7);
      doctest::detail::Result::~Result((Result *)0x19a6d3);
      dVar2 = doctest::detail::ResultBuilder::log
                        (&local_598,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if ((extraout_AL_01 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff720);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x19a7b2);
      __gnu_cxx::__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>
      ::operator++(&local_510);
    }
    tf::Taskflow::clear((Taskflow *)0x19a7ec);
    MoveOnly1::MoveOnly1(&local_5e8);
    local_5e8.a = 0;
    local_5f0 = (MoveOnly1 *)
                std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::begin
                          ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)pRVar7);
    local_5f8 = (MoveOnly1 *)
                std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::end
                          ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)pRVar7);
    local_618 = local_280;
    uStack_614 = uStack_27c;
    uStack_610 = uStack_278;
    uStack_60c = uStack_274;
    tf::FlowBuilder::
    reduce<__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly1,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1&,MoveOnly1&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>>
              (&local_620,&local_228,local_5f0,local_5f8,&local_5e8,CONCAT44(uStack_27c,local_280));
    puVar5 = local_140;
    tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                      in_stack_fffffffffffff720);
    std::__basic_future<void>::wait(local_640,puVar5);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff720);
    pRVar7 = (Result *)0x2150c5;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff740,at,(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff72c,(char *)in_stack_fffffffffffff720,"",
               (char *)in_stack_fffffffffffff750);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_6ec,DT_REQUIRE);
    EVar6 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                      ((ExpressionDecomposer *)in_stack_fffffffffffff720,(int *)pRVar7);
    in_stack_fffffffffffff750 = (Executor *)EVar6.lhs;
    local_6f8 = EVar6.m_at;
    local_708 = 0xfffffffffff551a0;
    local_700 = in_stack_fffffffffffff750;
    local_6e8 = in_stack_fffffffffffff750;
    local_6e0 = local_6f8;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (this,(unsigned_long *)CONCAT44(EVar4,in_stack_fffffffffffff7a0));
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff720,pRVar7);
    doctest::detail::Result::~Result((Result *)0x19a99e);
    dVar2 = doctest::detail::ResultBuilder::log
                      (&local_6b8,(double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
    if ((extraout_AL_02 & 1) != 0) break;
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff720);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x19aa9a);
    in_stack_fffffffffffff740 = &local_228;
    tf::Taskflow::clear((Taskflow *)0x19aaae);
    local_5e8.a = 0;
    in_stack_fffffffffffff738 = local_2a0;
    local_710 = (MoveOnly1 *)
                std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::begin
                          ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)pRVar7);
    local_718 = (MoveOnly1 *)
                std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::end
                          ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)pRVar7);
    local_738 = local_280;
    uStack_734 = uStack_27c;
    uStack_730 = uStack_278;
    uStack_72c = uStack_274;
    tf::FlowBuilder::
    reduce<__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly1,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1_const&,MoveOnly1_const&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>>
              (&local_740,in_stack_fffffffffffff740,local_710,local_718,&local_5e8,
               CONCAT44(uStack_27c,local_280));
    puVar5 = local_140;
    tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                      in_stack_fffffffffffff720);
    std::__basic_future<void>::wait(local_760,puVar5);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff720);
    in_stack_fffffffffffff718 = (Result *)0x2150c5;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff740,
               (Enum)((ulong)in_stack_fffffffffffff738 >> 0x20),(char *)in_stack_fffffffffffff730,
               in_stack_fffffffffffff72c,(char *)in_stack_fffffffffffff720,"",
               (char *)in_stack_fffffffffffff750);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_80c,DT_REQUIRE);
    EVar6 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                      ((ExpressionDecomposer *)in_stack_fffffffffffff720,
                       (int *)in_stack_fffffffffffff718);
    in_stack_fffffffffffff730 = (allocator_type *)EVar6.lhs;
    in_stack_fffffffffffff72c = EVar6.m_at;
    local_808 = in_stack_fffffffffffff730;
    local_800 = in_stack_fffffffffffff72c;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (this,(unsigned_long *)CONCAT44(EVar4,in_stack_fffffffffffff7a0));
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    doctest::detail::Result::~Result((Result *)0x19ac51);
    dVar2 = doctest::detail::ResultBuilder::log
                      (&local_7d8,(double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
    in_stack_fffffffffffff728 = CONCAT13(extraout_AL_03,(int3)in_stack_fffffffffffff728);
    if ((extraout_AL_03 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff720);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x19ad59);
    std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::~vector
              ((vector<MoveOnly1,_std::allocator<MoveOnly1>_> *)in_stack_fffffffffffff730);
    local_260 = local_260 + 1;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)(SUB84(dVar2,0));
  return;
}

Assistant:

void move_only_transform_reduce(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  for(size_t c : {0, 1, 3, 7, 99}) {

    P partitioner(c);
  
    taskflow.clear();

    const size_t N = 100000;
    std::vector<MoveOnly1> vec(N);

    for(auto& i : vec) i.a = 1;

    MoveOnly2 res;
    res.b = 100;

    taskflow.transform_reduce(vec.begin(), vec.end(), res,
      [](MoveOnly2 m1, MoveOnly2 m2) {
        MoveOnly2 lres;
        lres.b = m1.b + m2.b;
        return lres;
      },
      [](const MoveOnly1& m) {
        MoveOnly2 n;
        n.b = m.a;
        return n;
      },
      partitioner
    );

    executor.run(taskflow).wait();

    REQUIRE(res.b == N + 100);
    
    // change vec data
    taskflow.clear();
    res.b = 0;
    
    taskflow.transform_reduce(vec.begin(), vec.end(), res,
      [](MoveOnly2&& m1, MoveOnly2&& m2) {
        MoveOnly2 lres;
        lres.b = m1.b + m2.b;
        return lres;
      },
      [](MoveOnly1& m) {
        MoveOnly2 n;
        n.b = m.a;
        m.a = -7;
        return n;
      },
      partitioner
    );

    executor.run(taskflow).wait();
    REQUIRE(res.b == N);

    for(const auto& i : vec) {
      REQUIRE(i.a == -7);
    }

    // reduce
    taskflow.clear();
    MoveOnly1 red;
    red.a = 0;

    taskflow.reduce(vec.begin(), vec.end(), red,
      [](MoveOnly1& m1, MoveOnly1& m2){
        MoveOnly1 lres;
        lres.a = m1.a + m2.a;
        return lres;
      },
      partitioner
    );  

    executor.run(taskflow).wait();
    REQUIRE(red.a == -7*N);
    
    taskflow.clear();
    red.a = 0;

    taskflow.reduce(vec.begin(), vec.end(), red,
      [](const MoveOnly1& m1, const MoveOnly1& m2){
        MoveOnly1 lres;
        lres.a = m1.a + m2.a;
        return lres;
      },
      partitioner
    );  

    executor.run(taskflow).wait();
    REQUIRE(red.a == -7*N);
  }
}